

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int PAL_getc(PAL_FILE *f)

{
  int iVar1;
  undefined8 in_R9;
  int local_14;
  INT temp;
  INT nRetVal;
  PAL_FILE *f_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (f == (PAL_FILE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PAL_getc",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
            ,0x371,in_R9,0);
    fprintf(_stderr,"Expression: f != NULL\n");
  }
  local_14 = getc((FILE *)f->bsdFilePtr);
  if ((f->bTextMode != 0) && (local_14 == 0xd)) {
    iVar1 = getc((FILE *)f->bsdFilePtr);
    if (iVar1 == 10) {
      local_14 = 10;
    }
    else {
      iVar1 = ungetc(iVar1,(FILE *)f->bsdFilePtr);
      if ((iVar1 == -1) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
        abort();
      }
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_14;
  }
  abort();
}

Assistant:

int
_cdecl
PAL_getc(PAL_FILE * f)
{
    INT nRetVal = 0;
    INT temp =0;

    PERF_ENTRY(getc);
    ENTRY( "getc( %p )\n", f );

    _ASSERTE(f != NULL);

    CLEARERR(f);

    nRetVal = getc( f->bsdFilePtr );

    if ( (f->bTextMode) && (nRetVal == '\r') )
    {
        if ((temp = getc( f->bsdFilePtr ))== '\n')
        {
            nRetVal ='\n';
        }
        else if (EOF == ungetc( temp, f->bsdFilePtr ))
        {
            ERROR("ungetc operation failed\n");
        }
    }

    LOGEXIT( "getc returning %d\n", nRetVal );
    PERF_EXIT(getc);
    return nRetVal;
}